

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

void Min_CubeWrite(FILE *pFile,Min_Cube_t *pCube)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar12 [16];
  long lVar16;
  undefined1 in_XMM6 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  uVar6 = *(uint *)&pCube->field_0x8;
  uVar1 = uVar6 >> 10 & 0xfff;
  if (uVar1 == 0) {
    uVar8 = 0;
  }
  else {
    uVar3 = 0;
    uVar8 = 0;
    do {
      uVar5 = pCube->uData[uVar3] >> 1 ^ pCube->uData[uVar3];
      iVar9 = 0;
      iVar10 = 0;
      iVar11 = 0;
      iVar4 = 0x10;
      auVar12 = _DAT_008b5e80;
      do {
        auVar17 = pshuflw(in_XMM6,auVar12,0xfe);
        lVar16 = auVar17._0_8_;
        auVar19._0_4_ = uVar5 >> lVar16;
        auVar19._4_4_ = uVar5 >> lVar16;
        auVar19._8_4_ = uVar5 >> lVar16;
        auVar19._12_4_ = uVar5 >> lVar16;
        auVar17 = pshuflw(auVar17,auVar12,0x54);
        iVar13 = auVar12._4_4_;
        iVar14 = auVar12._8_4_;
        iVar15 = auVar12._12_4_;
        auVar18._0_8_ = auVar12._8_8_;
        auVar18._8_4_ = iVar14;
        auVar18._12_4_ = iVar15;
        auVar20 = pshuflw(auVar19,auVar18,0xfe);
        in_XMM6 = pshuflw(auVar18,auVar18,0x54);
        uVar8 = uVar8 + (uVar5 >> auVar17._0_8_ & 1);
        iVar9 = iVar9 + (auVar19._4_4_ & 1);
        iVar10 = iVar10 + (uVar5 >> in_XMM6._0_8_ & 1);
        iVar11 = iVar11 + (uVar5 >> auVar20._0_8_ & 1);
        auVar12._0_4_ = auVar12._0_4_ + 8;
        auVar12._4_4_ = iVar13 + 8;
        auVar12._8_4_ = iVar14 + 8;
        auVar12._12_4_ = iVar15 + 8;
        iVar4 = iVar4 + -4;
      } while (iVar4 != 0);
      uVar8 = iVar11 + iVar9 + iVar10 + uVar8;
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  if (uVar6 >> 0x16 != uVar8) {
    __assert_fail("(int)pCube->nLits == Min_CubeCountLits(pCube)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinUtil.c"
                  ,0x6d,"void Min_CubeWrite(FILE *, Min_Cube_t *)");
  }
  if ((uVar6 & 0x3ff) != 0) {
    bVar2 = 0;
    uVar6 = 0;
    do {
      bVar7 = (pCube->uData[uVar6 >> 4] >> (bVar2 & 0x1e) & 2) == 0;
      iVar4 = 0x31;
      if (bVar7) {
        iVar4 = 0x3f;
      }
      iVar9 = (uint)bVar7 * 3 + 0x2d;
      if ((pCube->uData[uVar6 >> 4] >> (bVar2 & 0x1e) & 1) == 0) {
        iVar9 = iVar4;
      }
      fputc(iVar9,(FILE *)pFile);
      uVar6 = uVar6 + 1;
      bVar2 = bVar2 + 2;
    } while (uVar6 < (*(uint *)&pCube->field_0x8 & 0x3ff));
  }
  fwrite(" 1\n",3,1,(FILE *)pFile);
  return;
}

Assistant:

void Min_CubeWrite( FILE * pFile, Min_Cube_t * pCube )
{
    int i;
    assert( (int)pCube->nLits == Min_CubeCountLits(pCube) );
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeHasBit(pCube, i*2) )
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
                fprintf( pFile, "-" );
            else
                fprintf( pFile, "0" );
        }
        else
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
                fprintf( pFile, "1" );
            else
                fprintf( pFile, "?" );
        }
    fprintf( pFile, " 1\n" );
//    fprintf( pFile, " %d\n", pCube->nLits );
}